

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalGhsMultiGenerator::VisitTarget
          (cmGlobalGhsMultiGenerator *this,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *temp,set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                *perm,
          vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *order,
          cmGeneratorTarget *ti)

{
  _Rb_tree_header *p_Var1;
  pointer *pppcVar2;
  iterator __position;
  bool bVar3;
  TargetDependSet *targets;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  bool bVar7;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar8;
  OrderedTargetDependSet sortedTargets;
  cmGeneratorTarget *local_a0;
  string local_98;
  _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
  local_78;
  
  p_Var1 = &(perm->_M_t)._M_impl.super__Rb_tree_header;
  p_Var6 = (perm->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < ti]) {
    if (*(cmGeneratorTarget **)(p_Var6 + 1) >= ti) {
      p_Var5 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var5 != p_Var1) &&
     (p_Var6 = p_Var5, ti < *(cmGeneratorTarget **)(p_Var5 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    local_a0 = ti;
    pVar8 = std::
            _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
            ::_M_insert_unique<cmGeneratorTarget_const*const&>
                      ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                        *)temp,&local_a0);
    bVar7 = true;
    if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      targets = cmGlobalGenerator::GetTargetDirectDepends(&this->super_cmGlobalGenerator,local_a0);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
      OrderedTargetDependSet::OrderedTargetDependSet
                ((OrderedTargetDependSet *)&local_78,targets,&local_98);
      p_Var4 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        p_Var4 = local_78._M_impl.super__Rb_tree_header._M_header._M_left;
      }
      for (; bVar7 = (_Rb_tree_header *)p_Var4 != &local_78._M_impl.super__Rb_tree_header, bVar7;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        bVar3 = VisitTarget(this,temp,perm,order,*(cmGeneratorTarget **)(p_Var4 + 1));
        if (bVar3) goto LAB_001fe802;
      }
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)perm,&local_a0);
      __position._M_current =
           (order->
           super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (order->
          super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>)
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
        _M_realloc_insert<cmGeneratorTarget_const*const&>
                  ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                   order,__position,&local_a0);
      }
      else {
        *__position._M_current = local_a0;
        pppcVar2 = &(order->
                    super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppcVar2 = *pppcVar2 + 1;
      }
LAB_001fe802:
      std::
      _Rb_tree<cmTargetDepend,_cmTargetDepend,_std::_Identity<cmTargetDepend>,_cmGlobalGhsMultiGenerator::TargetCompare,_std::allocator<cmTargetDepend>_>
      ::~_Rb_tree(&local_78);
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool cmGlobalGhsMultiGenerator::VisitTarget(
  std::set<cmGeneratorTarget const*>& temp,
  std::set<cmGeneratorTarget const*>& perm,
  std::vector<cmGeneratorTarget const*>& order, cmGeneratorTarget const* ti)
{
  /* check if permanent mark is set*/
  if (perm.find(ti) == perm.end()) {
    /* set temporary mark; check if revisit*/
    if (temp.insert(ti).second) {
      /* sort targets lexicographically to ensure that nodes are always visited
       * in the same order */
      OrderedTargetDependSet sortedTargets(this->GetTargetDirectDepends(ti),
                                           "");
      for (auto& di : sortedTargets) {
        if (this->VisitTarget(temp, perm, order, di)) {
          return true;
        }
      }
      /* mark as complete; insert into beginning of list*/
      perm.insert(ti);
      order.push_back(ti);
      return false;
    }
    /* revisiting item - not a DAG */
    return true;
  }
  /* already complete */
  return false;
}